

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrCMP0xc5(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  uint8_t reg;
  
  reg = in_RDI->A;
  argument = zeropage_addr((CPU *)CONCAT17(reg,in_stack_fffffffffffffff0));
  CMP(in_RDI,reg,argument);
  return 3;
}

Assistant:

int CPU::instrCMP0xc5() {
	CMP(A, zeropage_addr());
	return 3;
}